

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O3

bool __thiscall bssl::ParseExtension(bssl *this,Input extension_tlv,ParsedExtension *out)

{
  Input in;
  bool bVar1;
  Input *out_00;
  Input input;
  bool has_critical;
  Parser extension_parser;
  Input critical;
  Parser parser;
  bool local_61;
  Parser local_60;
  Input local_48;
  Parser local_30;
  
  out_00 = (Input *)extension_tlv.data_.size_;
  input.data_.size_ = (size_t)extension_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_30,input);
  der::Parser::Parser(&local_60);
  bVar1 = der::Parser::ReadSequence(&local_30,&local_60);
  if ((bVar1) && (bVar1 = der::Parser::ReadTag(&local_60,6,out_00), bVar1)) {
    *(undefined1 *)&out_00[2].data_.data_ = 0;
    local_48.data_.data_ = (uchar *)0x0;
    local_48.data_.size_ = 0;
    bVar1 = der::Parser::ReadOptionalTag(&local_60,1,&local_48,&local_61);
    if (bVar1) {
      if (local_61 == true) {
        in.data_.size_ = local_48.data_.size_;
        in.data_.data_ = local_48.data_.data_;
        bVar1 = der::ParseBool(in,(bool *)(out_00 + 2));
        if (!bVar1) {
          return false;
        }
        if (*(bool *)&out_00[2].data_.data_ != true) {
          return false;
        }
      }
      bVar1 = der::Parser::ReadTag(&local_60,4,out_00 + 1);
      if ((bVar1) && (bVar1 = der::Parser::HasMore(&local_60), !bVar1)) {
        bVar1 = der::Parser::HasMore(&local_30);
        return !bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ParseExtension(der::Input extension_tlv, ParsedExtension *out) {
  der::Parser parser(extension_tlv);

  //    Extension  ::=  SEQUENCE  {
  der::Parser extension_parser;
  if (!parser.ReadSequence(&extension_parser)) {
    return false;
  }

  //            extnID      OBJECT IDENTIFIER,
  if (!extension_parser.ReadTag(CBS_ASN1_OBJECT, &out->oid)) {
    return false;
  }

  //            critical    BOOLEAN DEFAULT FALSE,
  out->critical = false;
  bool has_critical;
  der::Input critical;
  if (!extension_parser.ReadOptionalTag(CBS_ASN1_BOOLEAN, &critical,
                                        &has_critical)) {
    return false;
  }
  if (has_critical) {
    if (!der::ParseBool(critical, &out->critical)) {
      return false;
    }
    if (!out->critical) {
      return false;  // DER-encoding requires DEFAULT values be omitted.
    }
  }

  //            extnValue   OCTET STRING
  if (!extension_parser.ReadTag(CBS_ASN1_OCTETSTRING, &out->value)) {
    return false;
  }

  // The Extension type does not have an extension point (everything goes in
  // extnValue).
  if (extension_parser.HasMore()) {
    return false;
  }

  // By definition the input was a single Extension sequence, so there shouldn't
  // be unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}